

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob.h
# Opt level: O0

void __thiscall ncnn::Blob::Blob(Blob *this,Blob *param_2)

{
  string *in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string(in_RDI,in_RSI);
  *(undefined8 *)(in_RDI + 0x20) = *(undefined8 *)(in_RSI + 0x20);
  *(undefined8 *)(in_RDI + 0x28) = *(undefined8 *)(in_RSI + 0x28);
  *(undefined8 *)(in_RDI + 0x30) = *(undefined8 *)(in_RSI + 0x30);
  *(undefined8 *)(in_RDI + 0x38) = *(undefined8 *)(in_RSI + 0x38);
  *(undefined4 *)(in_RDI + 0x40) = *(undefined4 *)(in_RSI + 0x40);
  *(undefined8 *)(in_RDI + 0x48) = *(undefined8 *)(in_RSI + 0x48);
  *(undefined4 *)(in_RDI + 0x50) = *(undefined4 *)(in_RSI + 0x50);
  *(undefined4 *)(in_RDI + 0x54) = *(undefined4 *)(in_RSI + 0x54);
  *(undefined4 *)(in_RDI + 0x58) = *(undefined4 *)(in_RSI + 0x58);
  *(undefined4 *)(in_RDI + 0x5c) = *(undefined4 *)(in_RSI + 0x5c);
  *(undefined4 *)(in_RDI + 0x60) = *(undefined4 *)(in_RSI + 0x60);
  *(undefined8 *)(in_RDI + 0x68) = *(undefined8 *)(in_RSI + 0x68);
  if (*(long *)(in_RDI + 0x30) != 0) {
    LOCK();
    **(int **)(in_RDI + 0x30) = **(int **)(in_RDI + 0x30) + 1;
    UNLOCK();
  }
  return;
}

Assistant:

class NCNN_EXPORT Blob
{
public:
    // empty
    Blob();

public:
#if NCNN_STRING
    // blob name
    std::string name;
#endif // NCNN_STRING
    // layer index which produce this blob as output
    int producer;
    // layer index which need this blob as input
    int consumer;
    // shape hint
    Mat shape;
}